

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TryCatchStatement.h
# Opt level: O1

void __thiscall
TryCatchStatement::TryCatchStatement
          (TryCatchStatement *this,Identifier *ident,ptr<StatementBlock> *tryBlock,
          ptr<StatementBlock> *catchBlock)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR_execute_0012eda0;
  (this->ident)._M_dataplus._M_p = (pointer)&(this->ident).field_2;
  pcVar1 = (ident->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ident,pcVar1,pcVar1 + ident->_M_string_length);
  (this->tryBlock).super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (tryBlock->super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (tryBlock->super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->tryBlock).super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->catchBlock).super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (catchBlock->super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (catchBlock->super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->catchBlock).super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

TryCatchStatement(Identifier ident, ptr<StatementBlock> tryBlock, ptr<StatementBlock> catchBlock)
            : ident(ident), tryBlock(tryBlock), catchBlock(catchBlock) { }